

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

BSTR __thiscall CmdLineArgsParser::GetCurrentString(CmdLineArgsParser *this)

{
  char16 cVar1;
  LPWSTR psz;
  Exception *this_00;
  WCHAR local_418 [4];
  char16 buffer [512];
  CmdLineArgsParser *this_local;
  
  buffer._1016_8_ = this;
  memset(local_418,0,0x400);
  cVar1 = CurChar(this);
  if ((cVar1 == L'\0') || (cVar1 == L' ')) {
    NextChar(this);
    this_local = (CmdLineArgsParser *)0x0;
  }
  else {
    if (cVar1 != L':') {
      this_00 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(this_00,L"Expected \':\'");
      __cxa_throw(this_00,&Exception::typeinfo,0);
    }
    NextChar(this);
    psz = ParseString(this,local_418,0x200,false);
    this_local = (CmdLineArgsParser *)SysAllocString(psz);
  }
  return (BSTR)this_local;
}

Assistant:

BSTR
CmdLineArgsParser::GetCurrentString()
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    switch (CurChar())
    {
    case ':':
        NextChar();
        return SysAllocString(ParseString(buffer, MaxTokenSize, false));
    case ' ':
    case 0:
        NextChar();
        return nullptr;
    default:
        throw Exception(_u("Expected ':'"));
    }
}